

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O0

int AF_AActor_A_ChangeCountFlags
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  uint uVar1;
  VMValue *pVVar2;
  bool bVar3;
  bool local_63;
  TFlags<ActorFlag5,_unsigned_int> local_60;
  TFlags<ActorFlag,_unsigned_int> local_5c;
  Self local_58;
  Self local_54;
  Self local_50;
  TFlags<ActorFlag5,_unsigned_int> local_4c;
  TFlags<ActorFlag,_unsigned_int> local_48;
  int local_44;
  int local_40;
  int secret;
  int item;
  int kill;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_18;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_18 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11cf,
                  "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    _item = (AActor *)(param->field_0).field_1.a;
    local_63 = true;
    if (_item != (AActor *)0x0) {
      local_63 = DObject::IsKindOf((DObject *)_item,AActor::RegistrationInfo.MyClass);
    }
    if (local_63 != false) {
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d0,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        secret = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d0,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        secret = (pVVar2->field_0).i;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d1,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_40 = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d1,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        local_40 = (pVVar2->field_0).i;
      }
      self._0_4_ = (int)self + 1;
      if ((int)self < ret_local._4_4_) {
        if ((char)defaultparam_local[(int)self].Count != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d2,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        local_44 = *(int *)&defaultparam_local[(int)self].Array;
      }
      else {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x11d2,
                        "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_18,(long)(int)self);
        local_44 = (pVVar2->field_0).i;
      }
      bVar3 = AActor::CountsAsKill(_item);
      if ((bVar3) && (0 < _item->health)) {
        level.total_monsters = level.total_monsters + -1;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_48,
                 (int)_item +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_48);
      if (uVar1 != 0) {
        level.total_items = level.total_items + -1;
      }
      TFlags<ActorFlag5,_unsigned_int>::operator&
                (&local_4c,
                 (int)_item +
                 (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
      if (uVar1 != 0) {
        level.total_secrets = level.total_secrets + -1;
      }
      if (secret != -1) {
        if (secret == 0) {
          operator~((EnumType)&local_50);
          TFlags<ActorFlag,_unsigned_int>::operator&=(&_item->flags,&local_50);
        }
        else {
          TFlags<ActorFlag,_unsigned_int>::operator|=(&_item->flags,MF_COUNTKILL);
        }
      }
      if (local_40 != -1) {
        if (local_40 == 0) {
          operator~((EnumType)&local_54);
          TFlags<ActorFlag,_unsigned_int>::operator&=(&_item->flags,&local_54);
        }
        else {
          TFlags<ActorFlag,_unsigned_int>::operator|=(&_item->flags,MF_COUNTITEM);
        }
      }
      if (local_44 != -1) {
        if (local_44 == 0) {
          operator~((EnumType)&local_58);
          TFlags<ActorFlag5,_unsigned_int>::operator&=(&_item->flags5,&local_58);
        }
        else {
          TFlags<ActorFlag5,_unsigned_int>::operator|=(&_item->flags5,MF5_COUNTSECRET);
        }
      }
      bVar3 = AActor::CountsAsKill(_item);
      if ((bVar3) && (0 < _item->health)) {
        level.total_monsters = level.total_monsters + 1;
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_5c,
                 (int)_item +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_5c);
      if (uVar1 != 0) {
        level.total_items = level.total_items + 1;
      }
      TFlags<ActorFlag5,_unsigned_int>::operator&
                (&local_60,
                 (int)_item +
                 (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_60);
      if (uVar1 != 0) {
        level.total_secrets = level.total_secrets + 1;
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x11cf,
                  "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x11cf,
                "int AF_AActor_A_ChangeCountFlags(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ChangeCountFlags)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(kill);
	PARAM_INT_DEF(item);
	PARAM_INT_DEF(secret);

	if (self->CountsAsKill() && self->health > 0) --level.total_monsters;
	if (self->flags & MF_COUNTITEM) --level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) --level.total_secrets;

	if (kill != -1)
	{
		if (kill == 0) self->flags &= ~MF_COUNTKILL;
		else self->flags |= MF_COUNTKILL;
	}

	if (item != -1)
	{
		if (item == 0) self->flags &= ~MF_COUNTITEM;
		else self->flags |= MF_COUNTITEM;
	}

	if (secret != -1)
	{
		if (secret == 0) self->flags5 &= ~MF5_COUNTSECRET;
		else self->flags5 |= MF5_COUNTSECRET;
	}
	if (self->CountsAsKill() && self->health > 0) ++level.total_monsters;
	if (self->flags & MF_COUNTITEM) ++level.total_items;
	if (self->flags5 & MF5_COUNTSECRET) ++level.total_secrets;
	return 0;
}